

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O1

void deqp::gles2::Functional::eval_length_vec3(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  float sqSum;
  float fVar2;
  float local_14 [3];
  
  local_14[0] = c->in[0].m_data[2];
  local_14[1] = c->in[0].m_data[0];
  local_14[2] = c->in[0].m_data[1];
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + local_14[lVar1] * local_14[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  (c->color).m_data[0] = fVar2;
  return;
}

Assistant:

void eval_cross_vec3 (ShaderEvalContext& c) { c.color.xyz()	= cross(c.in[0].swizzle(2, 0, 1), c.in[1].swizzle(1, 2, 0)); }